

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
* dgrminer::enumerate(set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                      *__return_storage_ptr__,
                     vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     *adjacency_lists,vector<int,_std::allocator<int>_> *graph_ids,
                     vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     *pattern_edge_list,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *nodes_occupied_by_antecedent,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *edges_occupied_by_antecedent,bool new_measures,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_pattern_occurrences,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_antecedent_occurrences)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  ulong *puVar3;
  _Rb_tree_header *p_Var4;
  int iVar5;
  int iVar6;
  int *piVar7;
  pointer piVar8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pvVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
  *p_Var13;
  size_type sVar14;
  reference piVar15;
  _Elt_pointer piVar16;
  iterator iVar17;
  pointer pvVar18;
  vector<int,_std::allocator<int>_> *pvVar19;
  int *piVar20;
  pointer paVar21;
  int iVar22;
  size_t i_4;
  pointer paVar23;
  int iVar24;
  ulong uVar25;
  int i_2;
  uint uVar26;
  size_t i;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  int g_id;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_330;
  ulong local_328;
  int local_31c;
  long local_318;
  ulong local_310;
  _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
  *local_308;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  vector<int,_std::allocator<int>_> real_ids_src;
  vector<int,_std::allocator<int>_> real_ids_dst;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_edge_info;
  vector<int,_std::allocator<int>_> real_ids_src_ind;
  vector<int,_std::allocator<int>_> real_ids_dst_ind;
  int n_1;
  int iStack_254;
  ulong uStack_250;
  ulong local_248;
  ulong *local_240;
  ulong *puStack_238;
  _Rb_tree_impl<std::less<int>,_true> local_230;
  __node_base_ptr *local_200;
  size_type local_1f8;
  __node_base local_1f0;
  size_type sStack_1e8;
  float local_1e0;
  size_t local_1d8;
  __node_base_ptr ap_Stack_1d0 [2];
  vector<int,_std::allocator<int>_> sequence_of_edge_indices;
  vector<int,_std::allocator<int>_> right_most_path_occurrence;
  set<int,_std::less<int>,_std::allocator<int>_> pattern_occurrence_vertexes;
  vector<int,_std::allocator<int>_> sequence_of_nodes;
  int n_1_1;
  undefined4 uStack_104;
  pointer local_100;
  vector<int,_std::allocator<int>_> real_second_edge_ids;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> edge_candidates_1;
  deque<int,_std::allocator<int>_> right_most_path;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_308 = (_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
               *)__return_storage_ptr__;
  find_rightmost_path(&right_most_path,pattern_edge_list);
  paVar23 = (pattern_edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar11 = ((long)(pattern_edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar23) / 0x28;
  piVar12 = paVar23->_M_elems + 1;
  iVar22 = 0;
  while (bVar31 = lVar11 != 0, lVar11 = lVar11 + -1, bVar31) {
    if (iVar22 <= *piVar12) {
      iVar22 = *piVar12;
    }
    piVar12 = piVar12 + 10;
  }
  local_330 = pattern_edge_list;
  for (uVar30 = 0;
      uVar30 < (ulong)(((long)(adjacency_lists->
                              super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(adjacency_lists->
                             super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x48);
      uVar30 = uVar30 + 1) {
    n_1 = 0;
    iStack_254 = 0;
    uStack_250 = 0;
    local_248._0_4_ = 0;
    local_248._4_4_ = 0;
    local_230._0_8_ = 0;
    local_240 = &uStack_250;
    puStack_238 = &uStack_250;
    std::
    vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
    ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
              ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                *)nodes_occupied_by_antecedent,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)&n_1
              );
    _n_1 = 0;
    uStack_250 = 0;
    local_248 = 0;
    local_230._0_8_ = 0;
    local_240 = &uStack_250;
    puStack_238 = &uStack_250;
    std::
    vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
    ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
              ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                *)edges_occupied_by_antecedent,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)&n_1
              );
  }
  piVar12 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var4 = &local_230.super__Rb_tree_header;
  do {
    if (piVar12 == piVar7) {
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                (&right_most_path.super__Deque_base<int,_std::allocator<int>_>);
      return (set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
              *)local_308;
    }
    g_id = *piVar12;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&adj_list,
             &(adjacency_lists->
              super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
              )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyList);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::vector(&adj_edge_info,
             &(adjacency_lists->
              super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
              )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyEdgeInfo);
    pvVar9 = local_330;
    _n_1 = _n_1 & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&real_ids_src,
               ((long)(local_330->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_330->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x28,(value_type_conflict *)&n_1,
               (allocator_type *)&pattern_occurrence_vertexes);
    _n_1 = _n_1 & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&real_ids_dst,
               ((long)(pvVar9->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar9->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x28,(value_type_conflict *)&n_1,
               (allocator_type *)&pattern_occurrence_vertexes);
    _n_1 = _n_1 & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&real_ids_dst_ind,
               ((long)(pvVar9->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar9->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x28,(value_type_conflict *)&n_1,
               (allocator_type *)&pattern_occurrence_vertexes);
    _n_1 = _n_1 & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::vector
              (&real_ids_src_ind,
               ((long)(pvVar9->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar9->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x28,(value_type_conflict *)&n_1,
               (allocator_type *)&pattern_occurrence_vertexes);
    pvVar18 = adj_list.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar30 = 0;
        uVar30 < (ulong)(((long)adj_list.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18) / 0x18);
        uVar30 = uVar30 + 1) {
      for (uVar25 = 0;
          uVar25 < (ulong)((long)pvVar18[uVar30].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)pvVar18[uVar30].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2); uVar25 = uVar25 + 1
          ) {
        bVar31 = is_adj_info_equal_to_pattern_edge
                           (adj_edge_info.
                            super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar30].
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar25,
                            (local_330->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,true);
        if (bVar31) {
          *real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = (int)uVar30;
          *real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start =
               adj_list.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar30].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar25];
          *real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = (int)uVar25;
          lVar11 = 0;
          uVar27 = 0;
          pvVar18 = adj_list.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          piVar20 = real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while( true ) {
            iVar10 = *piVar20;
            piVar8 = pvVar18[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)pvVar18[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar27)
            break;
            if (uVar30 == (long)piVar8[uVar27]) {
              flipAdjacencyInfo((array<int,_8UL> *)
                                ((long)(adj_edge_info.
                                        super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar10].
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar11));
              bVar31 = is_adj_info_equal_to_pattern_edge
                                 ((array<int,_8UL> *)&n_1,
                                  (local_330->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,true);
              pvVar18 = adj_list.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar20 = real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (bVar31) {
                *real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar27;
                break;
              }
            }
            uVar27 = uVar27 + 1;
            lVar11 = lVar11 + 0x20;
          }
          _n_1 = _n_1 & 0xffffffff00000000;
          std::vector<int,_std::allocator<int>_>::vector
                    (&sequence_of_nodes,(ulong)(iVar22 + 1),(value_type_conflict *)&n_1,
                     (allocator_type *)&pattern_occurrence_vertexes);
          *sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = (int)uVar30;
          sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1] =
               adj_list.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar30].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar25];
          _n_1 = _n_1 & 0xffffffff00000000;
          std::vector<int,_std::allocator<int>_>::vector
                    (&sequence_of_edge_indices,
                     ((long)(local_330->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_330->
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x28,
                     (value_type_conflict *)&n_1,(allocator_type *)&pattern_occurrence_vertexes);
          *sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = (int)uVar25;
          iVar10 = 1;
LAB_00134f88:
          local_310 = (ulong)iVar10;
          paVar23 = (local_330->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          paVar21 = (local_330->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          local_31c = iVar10;
          if ((ulong)(((long)paVar21 - (long)paVar23) / 0x28) <= local_310) {
            lVar11 = 0;
            for (uVar27 = 0; uVar27 < (ulong)(((long)paVar21 - (long)paVar23) / 0x28);
                uVar27 = uVar27 + 1) {
              _n_1 = CONCAT44(iStack_254,
                              real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar27]);
              iVar10 = real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar27];
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )((nodes_occupied_by_antecedent->
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + g_id),&n_1);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )((nodes_occupied_by_antecedent->
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + g_id),
                         (int *)((long)real_ids_dst.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar11));
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )((edges_occupied_by_antecedent->
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + g_id),
                         adj_edge_info.
                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[n_1].
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar10]._M_elems + 7);
              paVar23 = (local_330->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              paVar21 = (local_330->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              lVar11 = lVar11 + 4;
            }
            pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 _S_red;
            pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header;
            pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (new_measures) {
              uStack_250 = uStack_250 & 0xffffffff00000000;
              local_248 = 0;
              local_240 = &uStack_250;
              local_230._0_8_ = 0;
              lVar11 = 0;
              lVar28 = 0;
              puStack_238 = local_240;
              for (uVar27 = 0; uVar27 < (ulong)(((long)paVar21 - (long)paVar23) / 0x28);
                  uVar27 = uVar27 + 1) {
                n_1_1 = real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar27];
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&pattern_occurrence_vertexes,&n_1_1);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&pattern_occurrence_vertexes,
                           (int *)((long)real_ids_dst.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar28));
                paVar23 = (local_330->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if (*(int *)((long)paVar23->_M_elems + lVar11 + 0xc) != 0) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&n_1,&n_1_1);
                  paVar23 = (local_330->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                }
                if (*(int *)((long)paVar23->_M_elems + lVar11 + 0x20) != 0) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&n_1,(int *)((long)real_ids_dst.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start + lVar28
                                            ));
                  paVar23 = (local_330->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                }
                paVar21 = (local_330->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                lVar28 = lVar28 + 4;
                lVar11 = lVar11 + 0x28;
              }
              p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                         *)std::__detail::
                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)multiple_pattern_occurrences,&g_id);
              std::
              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
              ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                        (p_Var13,&pattern_occurrence_vertexes);
              p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                         *)std::__detail::
                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)multiple_antecedent_occurrences,&g_id);
              std::
              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
              ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                        (p_Var13,(set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)&n_1);
            }
            right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            for (uVar27 = 0; sVar14 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
                uVar27 < sVar14; uVar27 = uVar27 + 1) {
              piVar15 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                  (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start,uVar27);
              std::vector<int,_std::allocator<int>_>::push_back
                        (&right_most_path_occurrence,
                         sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + *piVar15);
            }
            piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
              piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            local_328 = CONCAT44(local_328._4_4_,
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish[-1]);
            paVar23 = (local_330->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if ((piVar16[-1] == paVar23[-1]._M_elems[0]) && (paVar23[-1]._M_elems[1] < piVar16[-1]))
            {
              lVar11 = 0;
              for (uVar27 = 0;
                  sVar14 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
                  uVar27 < sVar14; uVar27 = uVar27 + 1) {
                piVar15 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start,uVar27);
                if (*piVar15 ==
                    (local_330->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems[1]) {
                  uVar27 = lVar11 >> 0x20;
                  goto LAB_001354e1;
                }
                lVar11 = lVar11 + 0x100000000;
              }
            }
            uVar27 = 0;
LAB_001354e1:
            while( true ) {
              sVar14 = std::deque<int,_std::allocator<int>_>::size(&right_most_path);
              if (sVar14 - 1 <= uVar27) break;
              find_backward_edge_candidates
                        ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                         &n_1_1,&adj_list,&adj_edge_info,(int)local_328,
                         right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar27],&real_ids_src,
                         &real_ids_dst,&real_ids_dst_ind);
              lVar11 = 0x10;
              for (uVar29 = 0; uVar29 < (ulong)((long)local_100 - CONCAT44(uStack_104,n_1_1) >> 5);
                  uVar29 = uVar29 + 1) {
                piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur;
                if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                }
                iVar10 = piVar16[-1];
                piVar15 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start,uVar27);
                puVar3 = (ulong *)(CONCAT44(uStack_104,n_1_1) + -0x10 + lVar11);
                uStack_250 = *puVar3;
                local_248 = puVar3[1];
                plVar2 = (long *)(CONCAT44(uStack_104,n_1_1) + lVar11);
                local_240 = (ulong *)*plVar2;
                puStack_238 = (ulong *)plVar2[1];
                local_230.super__Rb_tree_header._M_header._M_color = _S_red;
                local_230.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_230.super__Rb_tree_header._M_node_count = 0;
                local_1f8 = 1;
                local_1f0._M_nxt = (_Hash_node_base *)0x0;
                sStack_1e8 = 0;
                local_1e0 = 1.0;
                local_1d8 = 0;
                ap_Stack_1d0[0] = (__node_base_ptr)0x0;
                _n_1 = CONCAT44(*piVar15,iVar10);
                local_230.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
                local_230.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
                local_200 = ap_Stack_1d0;
                iVar17 = std::
                         _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                         ::find((_Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                 *)local_308,(children_candidate *)&n_1);
                if ((_Rb_tree_header *)iVar17._M_node == p_Var1) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_230,&g_id);
                  if (new_measures) {
                    p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&local_200,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var13,&pattern_occurrence_vertexes);
                  }
                  std::
                  _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                  ::_M_insert_unique<dgrminer::children_candidate_const&>
                            (local_308,(children_candidate *)&n_1);
                }
                else {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&iVar17._M_node[2]._M_parent,&g_id);
                  if (new_measures) {
                    p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&iVar17._M_node[3]._M_right,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var13,&pattern_occurrence_vertexes);
                  }
                }
                children_candidate::~children_candidate((children_candidate *)&n_1);
                lVar11 = lVar11 + 0x20;
              }
              std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
              ~_Vector_base((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             *)&n_1_1);
              uVar27 = uVar27 + 1;
            }
            sVar14 = std::deque<int,_std::allocator<int>_>::size(&right_most_path);
            uVar27 = sVar14 & 0xffffffff;
            while( true ) {
              uVar26 = (uint)(uVar27 - 1);
              if ((int)uVar26 < 0) break;
              real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar29 = (ulong)(uVar26 & 0x7fffffff);
              local_328 = uVar27 - 1;
              find_forward_edge_candidates
                        (&edge_candidates_1,&adj_list,&adj_edge_info,
                         right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar29],&sequence_of_nodes,
                         &real_second_edge_ids);
              lVar11 = 0;
              for (uVar27 = 0;
                  uVar27 < (ulong)((long)edge_candidates_1.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)edge_candidates_1.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                  uVar27 = uVar27 + 1) {
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)&n_1_1,&pattern_occurrence_vertexes._M_t);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&n_1_1,
                           right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar29);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&n_1_1,
                           (int *)((long)real_second_edge_ids.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + lVar11));
                piVar15 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                    (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start,uVar29);
                piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur;
                if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_cur ==
                    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
                  piVar16 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                }
                uStack_250 = *(ulong *)((edge_candidates_1.
                                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                       lVar11 * 2);
                local_248 = *(ulong *)((edge_candidates_1.
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                       lVar11 * 2 + 2);
                local_240 = *(ulong **)
                             ((edge_candidates_1.
                               super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11 * 2 + 4
                             );
                puStack_238 = *(ulong **)
                               ((edge_candidates_1.
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar11 * 2 + 4 + 2);
                local_230.super__Rb_tree_header._M_header._M_color = _S_red;
                local_230.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_230.super__Rb_tree_header._M_node_count = 0;
                local_1f8 = 1;
                local_1f0._M_nxt = (_Hash_node_base *)0x0;
                sStack_1e8 = 0;
                local_1e0 = 1.0;
                local_1d8 = 0;
                ap_Stack_1d0[0] = (__node_base_ptr)0x0;
                _n_1 = CONCAT44(piVar16[-1] + 1,*piVar15);
                local_230.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
                local_230.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
                local_200 = ap_Stack_1d0;
                iVar17 = std::
                         _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                         ::find((_Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                 *)local_308,(children_candidate *)&n_1);
                if ((_Rb_tree_header *)iVar17._M_node == p_Var1) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_230,&g_id);
                  if (new_measures) {
                    p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&local_200,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var13,(set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1);
                  }
                  std::
                  _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                  ::_M_insert_unique<dgrminer::children_candidate_const&>
                            (local_308,(children_candidate *)&n_1);
                }
                else {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&iVar17._M_node[2]._M_parent,&g_id);
                  if (new_measures) {
                    p_Var13 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&iVar17._M_node[3]._M_right,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var13,(set<int,_std::less<int>,_std::allocator<int>_> *)&n_1_1);
                  }
                }
                children_candidate::~children_candidate((children_candidate *)&n_1);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)&n_1_1);
                lVar11 = lVar11 + 4;
              }
              std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
              ~_Vector_base(&edge_candidates_1.
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                           );
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>);
              uVar27 = local_328;
            }
            if (local_310 <
                (ulong)((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2)) {
              real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_310] = 0;
              real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_310] = 0;
              real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_310] = 0;
              real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_310] = 0;
            }
            iVar10 = local_31c + -1;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&pattern_occurrence_vertexes._M_t);
          }
          if (iVar10 != 0) {
            local_318 = (long)iVar10;
            paVar23 = (local_330->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_310 = local_318 * 0x28;
            iVar24 = paVar23[local_318]._M_elems[0];
            iVar5 = paVar23[local_318]._M_elems[1];
            iVar6 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar24];
            local_31c = iVar10;
            if (iVar5 < iVar24) {
              iVar10 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar5];
              uVar27 = (ulong)sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_318];
              local_328 = (ulong)iVar10;
              while( true ) {
                piVar8 = adj_list.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar6].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)adj_list.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar27)
                break;
                if ((piVar8[uVar27] == iVar10) &&
                   (bVar31 = is_adj_info_equal_to_pattern_edge
                                       (adj_edge_info.
                                        super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar27,
                                        (array<int,_10UL> *)
                                        ((long)((local_330->
                                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_elems + local_310),true), bVar31)) {
                  lVar11 = 0;
                  do {
                    if ((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2 == lVar11) {
                      real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = iVar6;
                      real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = iVar10;
                      iVar24 = (int)uVar27;
                      real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = iVar24;
                      lVar11 = 0;
                      uVar27 = 0;
                      goto LAB_00135afd;
                    }
                    bVar31 = false;
                    bVar32 = false;
                    if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11] == iVar6) &&
                       (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] == iVar10)) {
                      bVar32 = uVar27 == (long)real_ids_dst_ind.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar11];
                    }
                    if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11] == iVar10) &&
                       (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] == iVar6)) {
                      bVar31 = uVar27 == (long)real_ids_src_ind.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar11];
                    }
                    lVar11 = lVar11 + 1;
                  } while (!bVar31 && !bVar32);
                }
                uVar27 = uVar27 + 1;
              }
            }
            else {
              uVar27 = (ulong)sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_318];
              while (uVar27 < (ulong)((long)adj_list.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (long)adj_list.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start >> 2)) {
                local_328 = uVar27;
                bVar31 = is_adj_info_equal_to_pattern_edge
                                   (adj_edge_info.
                                    super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar6].
                                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar27,
                                    (array<int,_10UL> *)
                                    ((long)((local_330->
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                    local_310),true);
                if (bVar31) {
                  iVar10 = adj_list.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar6].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_328];
                  lVar11 = 0;
                  do {
                    if ((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2 == lVar11) {
                      real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = iVar6;
                      real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = iVar10;
                      real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[local_318] = (int)local_328;
                      lVar11 = 0;
                      uVar29 = 0;
                      pvVar18 = adj_list.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar27 = local_328;
                      goto LAB_00135a6f;
                    }
                    bVar31 = false;
                    bVar32 = false;
                    if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11] == iVar6) &&
                       (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] == iVar10)) {
                      bVar32 = local_328 ==
                               (long)real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar11];
                    }
                    if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11] == iVar10) &&
                       (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar11] == iVar6)) {
                      bVar31 = local_328 ==
                               (long)real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar11];
                    }
                    lVar11 = lVar11 + 1;
                  } while (!bVar31 && !bVar32);
                }
                uVar27 = local_328 + 1;
              }
            }
            sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_318] = 0;
            real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_318] = 0;
            real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_318] = 0;
            real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_318] = 0;
            iVar24 = 0;
            pvVar19 = &real_ids_src_ind;
            iVar10 = -1;
            goto LAB_00135bf5;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>);
        }
        pvVar18 = adj_list.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&real_ids_dst.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&real_ids_src.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
    ::~vector(&adj_edge_info);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&adj_list);
    piVar12 = piVar12 + 1;
  } while( true );
LAB_00135a6f:
  iVar24 = (int)uVar27;
  piVar8 = pvVar18[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)pvVar18[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= uVar29)
  goto LAB_00135bb5;
  if (piVar8[uVar29] == iVar6) {
    flipAdjacencyInfo((array<int,_8UL> *)
                      ((long)(adj_edge_info.
                              super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar10].
                              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11));
    bVar31 = is_adj_info_equal_to_pattern_edge
                       ((array<int,_8UL> *)&n_1,
                        (array<int,_10UL> *)
                        ((long)((local_330->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_310),
                        true);
    iVar24 = (int)local_328;
    pvVar18 = adj_list.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar27 = local_328;
    if (bVar31) {
      real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[local_318] = (int)uVar29;
      goto LAB_00135bb5;
    }
  }
  uVar29 = uVar29 + 1;
  lVar11 = lVar11 + 0x20;
  goto LAB_00135a6f;
LAB_00135bb5:
  sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar5] = iVar10;
LAB_00135bdb:
  iVar24 = iVar24 + 1;
  pvVar19 = &sequence_of_edge_indices;
  iVar10 = 1;
LAB_00135bf5:
  (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [local_318] = iVar24;
  iVar10 = local_31c + iVar10;
  goto LAB_00134f88;
LAB_00135afd:
  piVar8 = adj_list.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_328].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)adj_list.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_328].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)piVar8 >> 2) <= uVar27) goto LAB_00135bdb;
  if (piVar8[uVar27] == iVar6) {
    flipAdjacencyInfo((array<int,_8UL> *)
                      ((long)(adj_edge_info.
                              super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_328].
                              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar11));
    bVar31 = is_adj_info_equal_to_pattern_edge
                       ((array<int,_8UL> *)&n_1,
                        (array<int,_10UL> *)
                        ((long)((local_330->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_310),
                        true);
    if (bVar31) {
      real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[local_318] = (int)uVar27;
      goto LAB_00135bdb;
    }
  }
  uVar27 = uVar27 + 1;
  lVar11 = lVar11 + 0x20;
  goto LAB_00135afd;
}

Assistant:

std::set<children_candidate> enumerate(std::vector<AdjacencyListCrate> &adjacency_lists, std::vector<int> &graph_ids,
                                           std::vector<std::array<int, PAT___SIZE>> &pattern_edge_list,
                                           std::vector<std::set<int>> &nodes_occupied_by_antecedent,
                                           std::vector<std::set<int>> &edges_occupied_by_antecedent, bool new_measures,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_pattern_occurrences,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_antecedent_occurrences)
	{
        // this functions is used for finding children candidates (return value)
        // adjacency_lists - adjacency list for each graph
        // graph_ids - ids of snapshots with the pattern
        // pattern_edge_list - pattern whose children are to be searched for
        // nodes_occupied_by_antecedent - (output parameter)
        // edges_occupied_by_antecedent - (output parameter)

        // here will be the result:
		std::set<children_candidate> children_candidates;

        // right-most path used for candidate generation (similarly as in gSpan)
		std::deque<int> right_most_path = find_rightmost_path(pattern_edge_list);

		// use maximum node id as a limit of number of nodes (used later)
		int number_of_nodes_in_pattern_edge_list = 0;
		for (size_t i = 0; i < pattern_edge_list.size(); i++) {
			if (number_of_nodes_in_pattern_edge_list < pattern_edge_list[i][1]) number_of_nodes_in_pattern_edge_list = pattern_edge_list[i][1];
		}
		number_of_nodes_in_pattern_edge_list++;

		// initialize nodes_occupied_by_antecedent and edges_occupied_by_antecedent vectors
		for (int i = 0; i < adjacency_lists.size(); i++) {
			nodes_occupied_by_antecedent.push_back(std::set<int>());
			edges_occupied_by_antecedent.push_back(std::set<int>());
		}

		// find occurrences in each graph
		for (int g_id : graph_ids)
		{
            // get the adjacency list (and also edge info) for the graph currently being processed
			std::vector<std::vector<int>> adj_list = adjacency_lists[g_id].adjacencyList;
			std::vector<std::vector<std::array<int, 8>>> adj_edge_info = adjacency_lists[g_id].adjacencyEdgeInfo;

			// these two vectors save src and dst vertices (their IDs) which correspond to real occurrences of the src and dst vertices of the pattern
            // i.e. it is mapping from pattern vertex ids to vertex ids in adjacency list
			std::vector<int> real_ids_src(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst_ind(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_src_ind(pattern_edge_list.size(), 0);


			int index_in_pattern_edge_list = 0;  // which element of pattern_edge_list are we currently processing

			// find occurrences in the current adj_list
            // begin by going through all edges in the adjacency list of the current graph:
			for (size_t u = 0; u < adj_list.size(); u++)
			{
				for (size_t v = 0; v < adj_list[u].size(); v++)
				{
                    // check whether the current edge in the adjacency list is equal to the current edge pattern:
					if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[index_in_pattern_edge_list], true)) {
						// we found the first edge from pattern_edge_list in the adjacency list

						// which SRC and DST vertex ids (form adjacency list) were used:
						real_ids_src[0] = u;
						real_ids_dst[0] = adj_list[u][v];
                        // under which index can we find DST in the list edges going from SRC:
						real_ids_dst_ind[0] = v;
                        // and also the opposite information (under which index can we find SRC in the list of edges going from DST):
						for (size_t i = 0; i < adj_list[real_ids_dst[0]].size(); i++)
						{
							if (adj_list[real_ids_dst[0]][i] == u && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[real_ids_dst[0]][i]), pattern_edge_list[index_in_pattern_edge_list], true))
							{
								real_ids_src_ind[0] = i;
								break;
							}
						}

						// initialize the helping variables and vectors
						// here we have the real IDs of vertices 0, 1, 2, ... from the pattern (i.e. mapping of pattern vertex ID i to real vertex ID in adjacency list can be found under index i)
						std::vector<int> sequence_of_nodes(number_of_nodes_in_pattern_edge_list, 0);
						// first edge is always forward from 0 to 1:
						sequence_of_nodes[0] = u;
						sequence_of_nodes[1] = adj_list[u][v];

                        // for each edge from pattern_edge_list, we store the index of lastly processed neighbor of the relevant node (i.e. index in adj_list[src])
						// it is used for backtracking: if we backtrack we continue from that index and not from zero.
						std::vector<int> sequence_of_edge_indices(pattern_edge_list.size(), 0);
						sequence_of_edge_indices[index_in_pattern_edge_list] = v;
						index_in_pattern_edge_list++;

						// do depth first search
						while (true) {
							// if we found the occurrence of the whole pattern:
							if (index_in_pattern_edge_list >= pattern_edge_list.size())
							{
								// save antecedent nodes and edges (i.e. those that are not addition changes) to edges_occupied_by_antecedent and edges_occupied_by_antecedent
								// (used for anomalies)
								for (int i = 0; i < pattern_edge_list.size(); i++) {
									int n_1 = real_ids_src[i];
									int n_2 = real_ids_dst_ind[i];

									// all elements of the frequent pattern should be occupied
									nodes_occupied_by_antecedent[g_id].insert(n_1);
									nodes_occupied_by_antecedent[g_id].insert(real_ids_dst[i]);
									edges_occupied_by_antecedent[g_id].insert(adj_edge_info[n_1][n_2][ADJ_INFO_ID]);
								}

							  	std::set<int> pattern_occurrence_vertexes;

							  	// save pattern occurrence and antecedent occurrence in order to properly calculate new measures
							  	if (new_measures) {
								  	std::set<int> antecedent_vertexes;
								  	for (int i = 0; i < pattern_edge_list.size(); ++i) {
									  	int n_1 = real_ids_src[i];

									  	pattern_occurrence_vertexes.insert(n_1);
									  	pattern_occurrence_vertexes.insert(real_ids_dst[i]);

									  	if (pattern_edge_list[i][PAT_SRC_CHANGETIME] != 0) {
											antecedent_vertexes.insert(n_1);
										}

									  	if (pattern_edge_list[i][PAT_DST_CHANGETIME] != 0) {
											antecedent_vertexes.insert(real_ids_dst[i]);
										}
									}

								  	multiple_pattern_occurrences[g_id].insert(pattern_occurrence_vertexes);
								  	multiple_antecedent_occurrences[g_id].insert(antecedent_vertexes);
								}

								std::vector<int> right_most_path_occurrence;
								for (size_t i = 0; i < right_most_path.size(); i++)
								{
									right_most_path_occurrence.push_back(sequence_of_nodes[right_most_path[i]]);
								}

								// generate all children (i.e. generate all edges which can be appended to the base pattern(pattern_edge_list)) and their occurrence

								// first, generate the backward edges (candidates):
								int right_most_vertex = right_most_path_occurrence.back();

								int backward_starting_ind = 0;
								if (right_most_path.back() == pattern_edge_list.back()[PAT_SRC_ID] && pattern_edge_list.back()[PAT_SRC_ID] > pattern_edge_list.back()[PAT_DST_ID])
								{
									// if the last edge in edge_list is a backward edge from the current RMP, add only edges with greater code
									for (size_t i = 0; i < right_most_path.size(); i++)
									{
										if (right_most_path[i] == pattern_edge_list.back()[PAT_DST_ID])
										{
											backward_starting_ind = i;
											break;
										}
									}
								}

								for (int i = backward_starting_ind; i < right_most_path.size() - 1; i++)
								{
									std::vector<std::array<int, 8>> edge_candidates = find_backward_edge_candidates(adj_list, adj_edge_info,
										right_most_vertex, right_most_path_occurrence[i],
										real_ids_src, real_ids_dst, real_ids_dst_ind);

									// save the edge_candidates (i,j must be appended)
									for (int j = 0; j < edge_candidates.size(); j++)
									{
										// save all children candidates
										std::array<int, 10> e_cand = { right_most_path.back(), right_most_path[i],
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };

										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);

										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}
										}
										else {
											cc.occurrences.insert(g_id);

											if (new_measures) {
											  	cc.multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}

										  	children_candidates.insert(cc);
										}
									}
								}

								// forward candidates:
								for (int i = right_most_path.size() - 1; i >= 0; i--)
								{
								  	std::vector<int> real_second_edge_ids;
								  	// realne id1 right_most_path_occurrence[i]
									std::vector<std::array<int, 8>> edge_candidates = find_forward_edge_candidates(adj_list, adj_edge_info,
										right_most_path_occurrence[i], sequence_of_nodes, real_second_edge_ids);

									for (int j = 0; j < edge_candidates.size(); j++)
									{
									  	std::set<int> child_occurrence_vertexes = pattern_occurrence_vertexes;
									  	child_occurrence_vertexes.insert(right_most_path_occurrence[i]);
									  	child_occurrence_vertexes.insert(real_second_edge_ids[j]);

										std::array<int, 10> e_cand = { right_most_path[i], right_most_path.back() + 1,
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };


										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);


										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}
										}
										else
										{
											cc.occurrences.insert(g_id);

										  	if (new_measures) {
												cc.multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}

											children_candidates.insert(cc);
										}
									}
								}

								// and backtrack
								if (index_in_pattern_edge_list < real_ids_src.size())
								{
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

								}
								index_in_pattern_edge_list--;

							} // if (current_index_in_edge_list >= pattern_edge_list.size()) // (if we found the occurrence of the whole pattern)

							// if we backtracked down to 1, it means that we tried all possibilities from this starting point in the given adjacency list
							if (index_in_pattern_edge_list == 0)
							{
								break;
							}

							// traverse (i.e. try to match the rest of the pattern with respect to the selected starting position in adjacency list):
							// try to find the occurrence of this pattern edge:
							int i = pattern_edge_list[index_in_pattern_edge_list][0];
							int j = pattern_edge_list[index_in_pattern_edge_list][1];

                            // check whether the edge is forward or backward
							if (i > j)
							{
								// backward edge;
								// we already have both vertices (real ids from adjacency list) in sequence_of_nodes, so get them:
								int src = sequence_of_nodes[i];
								int dst = sequence_of_nodes[j];
								// find the first index of an edge from "src" to "dst" and save the index into sequence_of_edge_indices
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									// if we found the appropriate edge (don't use edge ID for matching):
									if (adj_list[src][edge_ind] == dst && is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										// there can be only one edge which exactly matches
										// check if that edge is already there (occupied by traversal):
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}

										if (!is_already_there)
										{
											should_backtrack = false;
                                            // store the positions
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;
											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}

									}
								}

								if (should_backtrack)
								{

									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;



									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

									index_in_pattern_edge_list--;
								}
							}
							else
							{
								// forward edge
								// "src" vertex is already known in this case
								int src = sequence_of_nodes[i];
								// (but we must find the appropriate "dst" vertex)
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									if (is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										int dst = adj_list[src][edge_ind];
										// check if that edge is already there:
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}
										if (!is_already_there)
										{
											should_backtrack = false;
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;

											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_nodes[j] = dst;
											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}
									}

								}

								if (should_backtrack)
								{
									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;
									index_in_pattern_edge_list--;
								}
							}

						}

					} // if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[current_index_in_edge_list], true))

				} // for (size_t v = 0; v < adj_list[u].size(); v++)
			} // for (size_t u = 0; u < adj_list.size(); u++)

		} // for (int g_id : graph_ids)

		return children_candidates;
	}